

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkinformation_p.cpp
# Opt level: O0

void QNetworkInformationBackend::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  QNetworkInformationBackend *_t;
  
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      reachabilityChanged((QNetworkInformationBackend *)0x2331c7,Unknown);
      break;
    case 1:
      behindCaptivePortalChanged((QNetworkInformationBackend *)0x2331e3,false);
      break;
    case 2:
      transportMediumChanged((QNetworkInformationBackend *)0x2331fa,Unknown);
      break;
    case 3:
      isMeteredChanged((QNetworkInformationBackend *)0x233216,false);
    }
  }
  if ((((in_ESI == 5) &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QNetworkInformationBackend::*)(QNetworkInformation::Reachability)>
                          (in_RCX,(void **)reachabilityChanged,0,0), !bVar1)) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkInformationBackend::*)(bool)>
                         (in_RCX,(void **)behindCaptivePortalChanged,0,1), !bVar1)) &&
     (bVar1 = QtMocHelpers::
              indexOfMethod<void(QNetworkInformationBackend::*)(QNetworkInformation::TransportMedium)>
                        (in_RCX,(void **)transportMediumChanged,0,2), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QNetworkInformationBackend::*)(bool)>
              (in_RCX,(void **)isMeteredChanged,0,3);
  }
  return;
}

Assistant:

void QNetworkInformationBackend::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkInformationBackend *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->reachabilityChanged((*reinterpret_cast< std::add_pointer_t<QNetworkInformation::Reachability>>(_a[1]))); break;
        case 1: _t->behindCaptivePortalChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->transportMediumChanged((*reinterpret_cast< std::add_pointer_t<QNetworkInformation::TransportMedium>>(_a[1]))); break;
        case 3: _t->isMeteredChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(QNetworkInformation::Reachability )>(_a, &QNetworkInformationBackend::reachabilityChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(bool )>(_a, &QNetworkInformationBackend::behindCaptivePortalChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(QNetworkInformation::TransportMedium )>(_a, &QNetworkInformationBackend::transportMediumChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(bool )>(_a, &QNetworkInformationBackend::isMeteredChanged, 3))
            return;
    }
}